

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O1

int ARKStepSetDeduceImplicitRhs(void *arkode_mem,int deduce)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepSetDeduceImplicitRhs",&local_10,&local_18);
  if (iVar1 == 0) {
    local_18->deduce_rhs = deduce;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ARKStepSetDeduceImplicitRhs(void *arkode_mem, sunbooleantype deduce)
{
  ARKodeMem        ark_mem;
  ARKodeARKStepMem step_mem;
  int              retval;

  /* access ARKodeARKStepMem structure and set function pointer */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetDeduceImplicitRhs",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  step_mem->deduce_rhs = deduce;
  return(ARK_SUCCESS);
}